

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  bool bVar6;
  xmlRelaxNGDefinePtr_conflict local_b0;
  xmlRelaxNGDefinePtr_conflict list_3;
  xmlRelaxNGDefinePtr_conflict list_2;
  xmlChar *temp_1;
  xmlChar *temp;
  xmlChar *cur_1;
  xmlChar *cur;
  xmlChar *val;
  xmlChar *oldend;
  xmlChar *oldvalue_1;
  xmlRelaxNGDefinePtr_conflict list_1;
  xmlChar *oldvalue;
  xmlRelaxNGDefinePtr_conflict list;
  xmlChar *nvalue;
  xmlChar *nval;
  xmlRelaxNGTypeLibraryPtr lib;
  int idx;
  xmlChar *value;
  int oldflags;
  int ret;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  value._4_4_ = 0;
  pxVar5 = ctxt->state->value;
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
    if ((pxVar5 != (xmlChar *)0x0) && (*pxVar5 != '\0')) {
      lib._4_4_ = 0;
      while( true ) {
        bVar6 = true;
        if ((pxVar5[lib._4_4_] != ' ') &&
           ((pxVar5[lib._4_4_] < 9 || (bVar6 = true, 10 < pxVar5[lib._4_4_])))) {
          bVar6 = pxVar5[lib._4_4_] == '\r';
        }
        if (!bVar6) break;
        lib._4_4_ = lib._4_4_ + 1;
      }
      if (pxVar5[lib._4_4_] != '\0') {
        value._4_4_ = -1;
      }
    }
    break;
  default:
    value._4_4_ = -1;
    break;
  case XML_RELAXNG_EXCEPT:
    for (list_3 = define->content; value._4_4_ = 0, list_3 != (xmlRelaxNGDefinePtr_conflict)0x0;
        list_3 = list_3->next) {
      iVar3 = xmlRelaxNGValidateValue(ctxt,list_3);
      if (iVar3 == 0) {
        return -1;
      }
    }
    break;
  case XML_RELAXNG_TEXT:
    break;
  case XML_RELAXNG_DATATYPE:
    value._4_4_ = xmlRelaxNGValidateDatatype(ctxt,pxVar5,define,ctxt->state->seq);
    if (value._4_4_ == 0) {
      xmlRelaxNGNextValue(ctxt);
    }
    break;
  case XML_RELAXNG_VALUE:
    iVar3 = xmlStrEqual(pxVar5,define->value);
    if (iVar3 == 0) {
      if (define->name == (xmlChar *)0x0) {
        pxVar4 = xmlRelaxNGNormalize(ctxt,define->value);
        pxVar5 = xmlRelaxNGNormalize(ctxt,pxVar5);
        if (((pxVar4 == (xmlChar *)0x0) || (pxVar5 == (xmlChar *)0x0)) ||
           (iVar3 = xmlStrEqual(pxVar4,pxVar5), iVar3 == 0)) {
          value._4_4_ = -1;
        }
        if (pxVar4 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar4);
        }
        if (pxVar5 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar5);
        }
      }
      else {
        pvVar1 = define->data;
        if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x20) == 0)) {
          value._4_4_ = -1;
        }
        else {
          value._4_4_ = (**(code **)((long)pvVar1 + 0x20))
                                  (*(undefined8 *)((long)pvVar1 + 8),define->name,define->value,
                                   define->node,define->attrs,pxVar5,ctxt->state->node);
        }
        if (value._4_4_ < 0) {
          xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TYPECMP,define->name,(xmlChar *)0x0,0);
          return -1;
        }
        if (value._4_4_ == 1) {
          value._4_4_ = 0;
        }
        else {
          value._4_4_ = -1;
        }
      }
    }
    if (value._4_4_ == 0) {
      xmlRelaxNGNextValue(ctxt);
    }
    break;
  case XML_RELAXNG_LIST:
    oldvalue_1 = (xmlChar *)define->content;
    pxVar5 = ctxt->state->value;
    pxVar4 = ctxt->state->endvalue;
    cur = xmlStrdup(pxVar5);
    if (cur == (xmlChar *)0x0) {
      cur = xmlStrdup("");
    }
    if (cur == (xmlChar *)0x0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOSTATE,(xmlChar *)0x0,(xmlChar *)0x0,0);
      return -1;
    }
    cur_1 = cur;
    while (*cur_1 != '\0') {
      if ((*cur_1 == ' ') || (((8 < *cur_1 && (*cur_1 < 0xb)) || (*cur_1 == '\r')))) {
        *cur_1 = '\0';
        while( true ) {
          cur_1 = cur_1 + 1;
          bVar6 = true;
          if ((*cur_1 != ' ') && ((*cur_1 < 9 || (bVar6 = true, 10 < *cur_1)))) {
            bVar6 = *cur_1 == '\r';
          }
          if (!bVar6) break;
          *cur_1 = '\0';
        }
      }
      else {
        cur_1 = cur_1 + 1;
      }
    }
    ctxt->state->endvalue = cur_1;
    cur_1 = cur;
    while( true ) {
      bVar6 = false;
      if (*cur_1 == '\0') {
        bVar6 = cur_1 != ctxt->state->endvalue;
      }
      if (!bVar6) break;
      cur_1 = cur_1 + 1;
    }
    ctxt->state->value = cur_1;
    for (; oldvalue_1 != (xmlChar *)0x0; oldvalue_1 = *(xmlChar **)(oldvalue_1 + 0x40)) {
      if (ctxt->state->value == ctxt->state->endvalue) {
        ctxt->state->value = (xmlChar *)0x0;
      }
      value._4_4_ = xmlRelaxNGValidateValue(ctxt,(xmlRelaxNGDefinePtr_conflict)oldvalue_1);
      if (value._4_4_ != 0) break;
    }
    if (((value._4_4_ == 0) && (ctxt->state->value != (xmlChar *)0x0)) &&
       (ctxt->state->value != ctxt->state->endvalue)) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_LISTEXTRA,ctxt->state->value,(xmlChar *)0x0,0);
      value._4_4_ = -1;
    }
    (*xmlFree)(cur);
    ctxt->state->value = pxVar5;
    ctxt->state->endvalue = pxVar4;
    break;
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_GROUP:
    for (local_b0 = define->content; value._4_4_ = 0, local_b0 != (xmlRelaxNGDefinePtr_conflict)0x0;
        local_b0 = local_b0->next) {
      iVar3 = xmlRelaxNGValidateValue(ctxt,local_b0);
      if (iVar3 != 0) {
        return -1;
      }
    }
    break;
  case XML_RELAXNG_REF:
  case XML_RELAXNG_PARENTREF:
    if (define->content == (xmlRelaxNGDefinePtr)0x0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NODEFINE,(xmlChar *)0x0,(xmlChar *)0x0,0);
      value._4_4_ = -1;
    }
    else {
      value._4_4_ = xmlRelaxNGValidateValue(ctxt,define->content);
    }
    break;
  case XML_RELAXNG_OPTIONAL:
    if ((ctxt->state->value == (xmlChar *)0x0) || (*ctxt->state->value == '\0')) {
      value._4_4_ = 0;
    }
    else {
      iVar3 = ctxt->flags;
      ctxt->flags = ctxt->flags | 1;
      pxVar5 = ctxt->state->value;
      iVar2 = xmlRelaxNGValidateValue(ctxt,define->content);
      ctxt->flags = iVar3;
      if (iVar2 == 0) {
        if (0 < ctxt->errNr) {
          xmlRelaxNGPopErrors(ctxt,0);
        }
        value._4_4_ = 0;
      }
      else {
        ctxt->state->value = pxVar5;
        if (0 < ctxt->errNr) {
          xmlRelaxNGPopErrors(ctxt,0);
        }
        value._4_4_ = 0;
      }
    }
    break;
  case XML_RELAXNG_ONEORMORE:
    value._4_4_ = xmlRelaxNGValidateValueList(ctxt,define->content);
    if (value._4_4_ != 0) {
      return value._4_4_;
    }
  case XML_RELAXNG_ZEROORMORE:
    if ((ctxt->state->value == (xmlChar *)0x0) || (*ctxt->state->value == '\0')) {
      value._4_4_ = 0;
    }
    else {
      iVar3 = ctxt->flags;
      ctxt->flags = ctxt->flags | 1;
      temp = ctxt->state->value;
      temp_1 = (xmlChar *)0x0;
      while( true ) {
        bVar6 = false;
        if ((temp != (xmlChar *)0x0) && (bVar6 = false, temp != ctxt->state->endvalue)) {
          bVar6 = temp_1 != temp;
        }
        if (!bVar6) goto LAB_001cd2e3;
        temp_1 = temp;
        iVar2 = xmlRelaxNGValidateValueList(ctxt,define->content);
        if (iVar2 != 0) break;
        temp = ctxt->state->value;
        value._4_4_ = 0;
      }
      ctxt->state->value = temp;
      value._4_4_ = 0;
LAB_001cd2e3:
      ctxt->flags = iVar3;
      if (0 < ctxt->errNr) {
        xmlRelaxNGPopErrors(ctxt,0);
      }
    }
    break;
  case XML_RELAXNG_CHOICE:
    oldvalue = (xmlChar *)define->content;
    iVar3 = ctxt->flags;
    ctxt->flags = ctxt->flags | 1;
    pxVar5 = ctxt->state->value;
    while ((oldvalue != (xmlChar *)0x0 &&
           (value._4_4_ = xmlRelaxNGValidateValue(ctxt,(xmlRelaxNGDefinePtr_conflict)oldvalue),
           value._4_4_ != 0))) {
      ctxt->state->value = pxVar5;
      oldvalue = *(xmlChar **)(oldvalue + 0x40);
    }
    ctxt->flags = iVar3;
    if (value._4_4_ == 0) {
      if (0 < ctxt->errNr) {
        xmlRelaxNGPopErrors(ctxt,0);
      }
    }
    else if ((ctxt->flags & 1U) == 0) {
      xmlRelaxNGDumpValidError(ctxt);
    }
  }
  return value._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,
                        xmlRelaxNGDefinePtr define)
{
    int ret = 0, oldflags;
    xmlChar *value;

    value = ctxt->state->value;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:{
                if ((value != NULL) && (value[0] != 0)) {
                    int idx = 0;

                    while (IS_BLANK_CH(value[idx]))
                        idx++;
                    if (value[idx] != 0)
                        ret = -1;
                }
                break;
            }
        case XML_RELAXNG_TEXT:
            break;
        case XML_RELAXNG_VALUE:{
                if (!xmlStrEqual(value, define->value)) {
                    if (define->name != NULL) {
                        xmlRelaxNGTypeLibraryPtr lib;

                        lib = (xmlRelaxNGTypeLibraryPtr) define->data;
                        if ((lib != NULL) && (lib->comp != NULL)) {
                            ret = lib->comp(lib->data, define->name,
                                            define->value, define->node,
                                            (void *) define->attrs,
                                            value, ctxt->state->node);
                        } else
                            ret = -1;
                        if (ret < 0) {
                            VALID_ERR2(XML_RELAXNG_ERR_TYPECMP,
                                       define->name);
                            return (-1);
                        } else if (ret == 1) {
                            ret = 0;
                        } else {
                            ret = -1;
                        }
                    } else {
                        xmlChar *nval, *nvalue;

                        /*
                         * TODO: trivial optimizations are possible by
                         * computing at compile-time
                         */
                        nval = xmlRelaxNGNormalize(ctxt, define->value);
                        nvalue = xmlRelaxNGNormalize(ctxt, value);

                        if ((nval == NULL) || (nvalue == NULL) ||
                            (!xmlStrEqual(nval, nvalue)))
                            ret = -1;
                        if (nval != NULL)
                            xmlFree(nval);
                        if (nvalue != NULL)
                            xmlFree(nvalue);
                    }
                }
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);
                break;
            }
        case XML_RELAXNG_DATATYPE:{
                ret = xmlRelaxNGValidateDatatype(ctxt, value, define,
                                                 ctxt->state->seq);
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);

                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue;

                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;

                oldvalue = ctxt->state->value;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        break;
                    }
                    ctxt->state->value = oldvalue;
                    list = list->next;
                }
                ctxt->flags = oldflags;
                if (ret != 0) {
                    if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                        xmlRelaxNGDumpValidError(ctxt);
                } else {
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                }
                break;
            }
        case XML_RELAXNG_LIST:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue, *oldend, *val, *cur;

                oldvalue = ctxt->state->value;
                oldend = ctxt->state->endvalue;

                val = xmlStrdup(oldvalue);
                if (val == NULL) {
                    val = xmlStrdup(BAD_CAST "");
                }
                if (val == NULL) {
                    VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
                    return (-1);
                }
                cur = val;
                while (*cur != 0) {
                    if (IS_BLANK_CH(*cur)) {
                        *cur = 0;
                        cur++;
                        while (IS_BLANK_CH(*cur))
                            *cur++ = 0;
                    } else
                        cur++;
                }
                ctxt->state->endvalue = cur;
                cur = val;
                while ((*cur == 0) && (cur != ctxt->state->endvalue))
                    cur++;

                ctxt->state->value = cur;

                while (list != NULL) {
                    if (ctxt->state->value == ctxt->state->endvalue)
                        ctxt->state->value = NULL;
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        break;
                    }
                    list = list->next;
                }

                if ((ret == 0) && (ctxt->state->value != NULL) &&
                    (ctxt->state->value != ctxt->state->endvalue)) {
                    VALID_ERR2(XML_RELAXNG_ERR_LISTEXTRA,
                               ctxt->state->value);
                    ret = -1;
                }
                xmlFree(val);
                ctxt->state->value = oldvalue;
                ctxt->state->endvalue = oldend;
                break;
            }
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGValidateValueList(ctxt, define->content);
            if (ret != 0) {
                break;
            }
            /* Falls through. */
        case XML_RELAXNG_ZEROORMORE:{
                xmlChar *cur, *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                cur = ctxt->state->value;
                temp = NULL;
                while ((cur != NULL) && (cur != ctxt->state->endvalue) &&
                       (temp != cur)) {
                    temp = cur;
                    ret =
                        xmlRelaxNGValidateValueList(ctxt, define->content);
                    if (ret != 0) {
                        ctxt->state->value = temp;
                        ret = 0;
                        break;
                    }
                    cur = ctxt->state->value;
                }
                ctxt->flags = oldflags;
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_OPTIONAL:{
                xmlChar *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                temp = ctxt->state->value;
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
                ctxt->flags = oldflags;
                if (ret != 0) {
                    ctxt->state->value = temp;
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                    ret = 0;
                    break;
                }
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_EXCEPT:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_PARENTREF:
	    if (define->content == NULL) {
                VALID_ERR(XML_RELAXNG_ERR_NODEFINE);
                ret = -1;
	    } else {
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
            }
            break;
        default:
            /* TODO */
            ret = -1;
    }
    return (ret);
}